

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O2

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototypeNoLock
          (DynamicMessageFactory *this,Descriptor *type)

{
  uint uVar1;
  int iVar2;
  TypeInfo *type_info;
  DescriptorPool *pDVar3;
  _Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_true,_std::tr1::_Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>_>
  *this_00;
  mapped_type *ppTVar4;
  int *p;
  MessageFactory *pMVar5;
  undefined4 extraout_var;
  LogMessage *other;
  DynamicMessage *this_01;
  GeneratedMessageReflection *this_02;
  DescriptorPool *pDVar6;
  long lVar7;
  long lVar8;
  Descriptor *pDVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  LogFinisher local_89;
  Descriptor *type_local;
  TypeInfo *local_80;
  DynamicMessageFactory *local_78;
  int *local_70;
  LogMessage local_68;
  
  type_local = type;
  if ((this->delegate_to_generated_factory_ == true) &&
     (pDVar6 = *(DescriptorPool **)(*(long *)(type + 0x10) + 0x10),
     pDVar3 = DescriptorPool::generated_pool(), pDVar6 == pDVar3)) {
    pMVar5 = MessageFactory::generated_factory();
    iVar14 = (*pMVar5->_vptr_MessageFactory[2])(pMVar5,type);
    return (Message *)CONCAT44(extraout_var,iVar14);
  }
  this_00 = (_Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_true,_std::tr1::_Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>_>
             *)internal::scoped_ptr<google::protobuf::DynamicMessageFactory::PrototypeMap>::
               operator->(&this->prototypes_);
  ppTVar4 = std::tr1::__detail::
            _Map_base<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_true,_std::tr1::_Hashtable<const_google::protobuf::Descriptor_*,_std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::_Select1st<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessage::TypeInfo_*>_>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>_>
            ::operator[](this_00,&type_local);
  if (*ppTVar4 == (mapped_type)0x0) {
    local_80 = (TypeInfo *)operator_new(0x40);
    (local_80->offsets).array_ = (int *)0x0;
    (local_80->reflection).ptr_ = (GeneratedMessageReflection *)0x0;
    local_80->prototype = (DynamicMessage *)0x0;
    *ppTVar4 = local_80;
    local_80->type = type_local;
    pDVar6 = this->pool_;
    if (pDVar6 == (DescriptorPool *)0x0) {
      pDVar6 = *(DescriptorPool **)(*(long *)(type_local + 0x10) + 0x10);
    }
    local_80->pool = pDVar6;
    local_80->factory = this;
    uVar10 = 0xffffffffffffffff;
    if (-1 < (long)*(int *)(type_local + 0x2c)) {
      uVar10 = (long)*(int *)(type_local + 0x2c) * 4;
    }
    local_78 = this;
    p = (int *)operator_new__(uVar10);
    internal::scoped_array<int>::reset(&local_80->offsets,p);
    local_80->has_bits_offset = 0x18;
    iVar14 = *(int *)(type_local + 0x2c);
    iVar12 = ((iVar14 + 0x1f) / 0x20) * 4 + 0x1f;
    iVar2 = 8;
    iVar12 = iVar12 - iVar12 % 8;
    if (*(int *)(type_local + 0x58) < 1) {
      iVar11 = -1;
      iVar13 = iVar12;
    }
    else {
      iVar13 = (iVar12 + 0x37) - (iVar12 + 0x37) % 8;
      iVar11 = iVar12;
    }
    local_80->extensions_offset = iVar11;
    lVar8 = 0xc;
    pDVar9 = type_local;
    local_70 = p;
    for (lVar7 = 0; type_info = local_80, lVar7 < iVar14; lVar7 = lVar7 + 1) {
      uVar1 = *(uint *)(FieldDescriptor::kTypeToCppTypeMap +
                       (ulong)*(uint *)(*(long *)(pDVar9 + 0x30) + -4 + lVar8 * 4) * 4);
      iVar14 = iVar2;
      if (*(int *)(*(long *)(pDVar9 + 0x30) + lVar8 * 4) == 3) {
        iVar12 = 0x10;
        if (7 < uVar1 - 1) {
          if ((uVar1 != 9) && (uVar1 != 10)) goto LAB_001b85f1;
          iVar12 = 0x18;
        }
      }
      else if (uVar1 < 0xb) {
        iVar12 = iVar2;
        if ((0x634U >> (uVar1 & 0x1f) & 1) == 0) {
          if ((0x14aU >> (uVar1 & 0x1f) & 1) == 0) {
            if (uVar1 != 7) goto LAB_001b85f1;
            iVar14 = 1;
            iVar12 = 1;
          }
          else {
            iVar14 = 4;
            iVar12 = 4;
          }
        }
      }
      else {
LAB_001b85f1:
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/dynamic_message.cc"
                   ,0x8c);
        other = internal::LogMessage::operator<<(&local_68,"Can\'t get here.");
        internal::LogFinisher::operator=(&local_89,other);
        internal::LogMessage::~LogMessage(&local_68);
        pDVar9 = type_local;
        p = local_70;
        iVar14 = 0;
        iVar12 = 0;
      }
      iVar13 = iVar13 + iVar14 + -1;
      iVar13 = iVar13 - iVar13 % iVar14;
      p[lVar7] = iVar13;
      iVar13 = iVar13 + iVar12;
      iVar14 = *(int *)(pDVar9 + 0x2c);
      lVar8 = lVar8 + 0x1e;
    }
    iVar14 = (iVar13 + 7) - (iVar13 + 7) % 8;
    local_80->unknown_fields_offset = iVar14;
    iVar14 = (iVar14 - (iVar14 + 0xf) % 8) + 0xf;
    local_80->size = iVar14;
    this_01 = (DynamicMessage *)operator_new((long)iVar14);
    memset(this_01,0,(long)iVar14);
    DynamicMessage::DynamicMessage(this_01,type_info);
    type_info->prototype = this_01;
    this_02 = (GeneratedMessageReflection *)operator_new(0x40);
    internal::GeneratedMessageReflection::GeneratedMessageReflection
              (this_02,type_info->type,(Message *)this_01,(type_info->offsets).array_,
               type_info->has_bits_offset,type_info->unknown_fields_offset,
               type_info->extensions_offset,type_info->pool,&local_78->super_MessageFactory,
               type_info->size);
    internal::scoped_ptr<const_google::protobuf::internal::GeneratedMessageReflection>::reset
              (&type_info->reflection,this_02);
    DynamicMessage::CrossLinkPrototypes(this_01);
  }
  else {
    this_01 = (*ppTVar4)->prototype;
  }
  return &this_01->super_Message;
}

Assistant:

const Message* DynamicMessageFactory::GetPrototypeNoLock(
    const Descriptor* type) {
  if (delegate_to_generated_factory_ &&
      type->file()->pool() == DescriptorPool::generated_pool()) {
    return MessageFactory::generated_factory()->GetPrototype(type);
  }

  const DynamicMessage::TypeInfo** target = &prototypes_->map_[type];
  if (*target != NULL) {
    // Already exists.
    return (*target)->prototype;
  }

  DynamicMessage::TypeInfo* type_info = new DynamicMessage::TypeInfo;
  *target = type_info;

  type_info->type = type;
  type_info->pool = (pool_ == NULL) ? type->file()->pool() : pool_;
  type_info->factory = this;

  // We need to construct all the structures passed to
  // GeneratedMessageReflection's constructor.  This includes:
  // - A block of memory that contains space for all the message's fields.
  // - An array of integers indicating the byte offset of each field within
  //   this block.
  // - A big bitfield containing a bit for each field indicating whether
  //   or not that field is set.

  // Compute size and offsets.
  int* offsets = new int[type->field_count()];
  type_info->offsets.reset(offsets);

  // Decide all field offsets by packing in order.
  // We place the DynamicMessage object itself at the beginning of the allocated
  // space.
  int size = sizeof(DynamicMessage);
  size = AlignOffset(size);

  // Next the has_bits, which is an array of uint32s.
  type_info->has_bits_offset = size;
  int has_bits_array_size =
    DivideRoundingUp(type->field_count(), bitsizeof(uint32));
  size += has_bits_array_size * sizeof(uint32);
  size = AlignOffset(size);

  // The ExtensionSet, if any.
  if (type->extension_range_count() > 0) {
    type_info->extensions_offset = size;
    size += sizeof(ExtensionSet);
    size = AlignOffset(size);
  } else {
    // No extensions.
    type_info->extensions_offset = -1;
  }

  // All the fields.
  for (int i = 0; i < type->field_count(); i++) {
    // Make sure field is aligned to avoid bus errors.
    int field_size = FieldSpaceUsed(type->field(i));
    size = AlignTo(size, min(kSafeAlignment, field_size));
    offsets[i] = size;
    size += field_size;
  }

  // Add the UnknownFieldSet to the end.
  size = AlignOffset(size);
  type_info->unknown_fields_offset = size;
  size += sizeof(UnknownFieldSet);

  // Align the final size to make sure no clever allocators think that
  // alignment is not necessary.
  size = AlignOffset(size);
  type_info->size = size;

  // Allocate the prototype.
  void* base = operator new(size);
  memset(base, 0, size);
  DynamicMessage* prototype = new(base) DynamicMessage(type_info);
  type_info->prototype = prototype;

  // Construct the reflection object.
  type_info->reflection.reset(
    new GeneratedMessageReflection(
      type_info->type,
      type_info->prototype,
      type_info->offsets.get(),
      type_info->has_bits_offset,
      type_info->unknown_fields_offset,
      type_info->extensions_offset,
      type_info->pool,
      this,
      type_info->size));

  // Cross link prototypes.
  prototype->CrossLinkPrototypes();

  return prototype;
}